

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

uint __thiscall crnlib::dxt_image::get_pixel_alpha(dxt_image *this,uint x,uint y,uint element_index)

{
  element_type eVar1;
  element *peVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar10 = x >> 2;
  uVar7 = y >> 2;
  eVar1 = this->m_element_type[element_index];
  if (eVar1 != cAlphaDXT5) {
    if (eVar1 == cAlphaDXT3) {
      uVar3 = dxt3_block::get_alpha
                        ((dxt3_block *)
                         (this->m_pElements +
                         ((uVar7 * this->m_blocks_x + uVar10) * this->m_num_elements_per_block +
                         element_index)),x & 3,y & 3,true);
      return uVar3;
    }
    if (eVar1 != cColorDXT1) {
      return 0xff;
    }
    if (cDXT1A < this->m_format) {
      return 0xff;
    }
    peVar2 = this->m_pElements;
    uVar7 = (uVar7 * this->m_blocks_x + uVar10) * this->m_num_elements_per_block + element_index;
    if (*(ushort *)peVar2[uVar7].m_bytes <= *(ushort *)(peVar2[uVar7].m_bytes + 2)) {
      uVar3 = 0xff;
      if ((~(peVar2[uVar7].m_bytes[(ulong)(y & 3) + 4] >> ((char)x * '\x02' & 6U)) & 3) == 0) {
        uVar3 = 0;
      }
      return uVar3;
    }
    return 0xff;
  }
  peVar2 = this->m_pElements;
  uVar8 = (uVar7 * this->m_blocks_x + uVar10) * this->m_num_elements_per_block + element_index;
  uVar9 = (uint)peVar2[uVar8].m_bytes[0];
  uVar11 = (uint)peVar2[uVar8].m_bytes[1];
  uVar7 = (x & 3) + (y & 3) * 4;
  uVar10 = uVar7 * 3;
  uVar6 = (ulong)(uVar10 >> 3);
  uVar5 = (uint)peVar2[uVar8].m_bytes[uVar6 + 2];
  if (uVar7 < 0xe) {
    uVar5 = (uint)CONCAT11(peVar2[uVar8].m_bytes[uVar6 + 3],peVar2[uVar8].m_bytes[uVar6 + 2]);
  }
  uVar7 = uVar5 >> ((byte)uVar10 & 7) & 7;
  if (peVar2[uVar8].m_bytes[1] < peVar2[uVar8].m_bytes[0]) {
    switch(uVar7) {
    case 0:
switchD_0019379c_caseD_7:
      return uVar9;
    case 1:
switchD_00193780_caseD_1:
      return uVar11;
    case 2:
      iVar4 = uVar11 + uVar9 * 6;
      break;
    case 3:
      iVar4 = uVar9 * 5 + uVar11 * 2;
      break;
    case 4:
      iVar4 = uVar11 * 3 + uVar9 * 4;
      break;
    case 5:
      iVar4 = uVar9 * 3 + uVar11 * 4;
      break;
    case 6:
      iVar4 = uVar11 * 5 + uVar9 * 2;
      break;
    case 7:
      iVar4 = uVar9 + uVar11 * 6;
    }
    uVar7 = iVar4 * 0x2493;
  }
  else {
    switch(uVar7) {
    case 0:
      goto switchD_0019379c_caseD_7;
    case 1:
      goto switchD_00193780_caseD_1;
    case 2:
      iVar4 = uVar11 + uVar9 * 4;
      break;
    case 3:
      iVar4 = uVar9 * 3 + uVar11 * 2;
      break;
    case 4:
      iVar4 = uVar11 * 3 + uVar9 * 2;
      break;
    case 5:
      iVar4 = uVar9 + uVar11 * 4;
      break;
    case 6:
      return 0;
    case 7:
      return 0xff;
    }
    uVar7 = iVar4 * 0x3334;
  }
  return uVar7 >> 0x10;
}

Assistant:

uint dxt_image::get_pixel_alpha(uint x, uint y, uint element_index) const {
  CRNLIB_ASSERT((x < m_width) && (y < m_height) && (element_index < m_num_elements_per_block));

  const uint block_x = x >> cDXTBlockShift;
  const uint block_y = y >> cDXTBlockShift;

  switch (m_element_type[element_index]) {
    case cColorDXT1: {
      if (m_format <= cDXT1A) {
        const dxt1_block* pBlock = reinterpret_cast<const dxt1_block*>(&get_element(block_x, block_y, element_index));

        const uint l = pBlock->get_low_color();
        const uint h = pBlock->get_high_color();

        if (l <= h) {
          uint s = pBlock->get_selector(x & 3, y & 3);

          return (s == 3) ? 0 : 255;
        } else {
          return 255;
        }
      }

      break;
    }
    case cAlphaDXT5: {
      const dxt5_block* pBlock = reinterpret_cast<const dxt5_block*>(&get_element(block_x, block_y, element_index));

      const uint l = pBlock->get_low_alpha();
      const uint h = pBlock->get_high_alpha();

      const uint s = pBlock->get_selector(x & 3, y & 3);

      if (l > h) {
        switch (s) {
          case 0:
            return l;
          case 1:
            return h;
          case 2:
            return (l * 6 + h) / 7;
          case 3:
            return (l * 5 + h * 2) / 7;
          case 4:
            return (l * 4 + h * 3) / 7;
          case 5:
            return (l * 3 + h * 4) / 7;
          case 6:
            return (l * 2 + h * 5) / 7;
          case 7:
            return (l + h * 6) / 7;
        }
      } else {
        switch (s) {
          case 0:
            return l;
          case 1:
            return h;
          case 2:
            return (l * 4 + h) / 5;
          case 3:
            return (l * 3 + h * 2) / 5;
          case 4:
            return (l * 2 + h * 3) / 5;
          case 5:
            return (l + h * 4) / 5;
          case 6:
            return 0;
          case 7:
            return 255;
        }
      }
    }
    case cAlphaDXT3: {
      const dxt3_block* pBlock = reinterpret_cast<const dxt3_block*>(&get_element(block_x, block_y, element_index));

      return pBlock->get_alpha(x & 3, y & 3, true);
    }
    default:
      break;
  }

  return 255;
}